

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeObjectiveFunction.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeObjectiveFunction::setCoor
          (FluctuatingChargeObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  pointer ppAVar1;
  pointer pdVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  Atom *pAVar5;
  long lVar6;
  MoleculeIterator i;
  MoleculeIterator local_28;
  
  local_28._M_node = (_Base_ptr)0x0;
  (*this->info_->sman_->_vptr_SnapshotManager[2])();
  pMVar3 = SimInfo::beginMolecule(this->info_,&local_28);
  lVar6 = 0;
  while (pMVar3 != (Molecule *)0x0) {
    ppAVar4 = (pMVar3->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppAVar1 = (pMVar3->fluctuatingCharges_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppAVar4 == ppAVar1) {
      pAVar5 = (Atom *)0x0;
    }
    else {
      pAVar5 = *ppAVar4;
    }
    pdVar2 = (x->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(int)lVar6;
    while (ppAVar4 = ppAVar4 + 1, pAVar5 != (Atom *)0x0) {
      *(double *)
       (*(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                         flucQPos.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + (pAVar5->super_StuntDouble).storage_) +
       (long)(pAVar5->super_StuntDouble).localIndex_ * 8) = pdVar2[lVar6];
      if (ppAVar4 == ppAVar1) {
        pAVar5 = (Atom *)0x0;
      }
      else {
        pAVar5 = *ppAVar4;
      }
      lVar6 = lVar6 + 1;
    }
    pMVar3 = SimInfo::nextMolecule(this->info_,&local_28);
  }
  return;
}

Assistant:

void FluctuatingChargeObjectiveFunction::setCoor(
      const DynamicVector<RealType>& x) const {
    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    info_->getSnapshotManager()->advance();

    int index;
#ifdef IS_MPI
    index = displacements_[myrank_];
#else
    index = 0;
#endif

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        atom->setFlucQPos(x[index++]);
      }
    }
  }